

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# throw_exception.hpp
# Opt level: O0

void boost::throw_exception<boost::bad_get>(bad_get *e)

{
  clone_impl<boost::exception_detail::error_info_injector<boost::bad_get>_> *__return_storage_ptr__;
  error_info_injector<boost::bad_get> *x;
  type local_40;
  bad_get *local_10;
  bad_get *e_local;
  
  local_10 = e;
  throw_exception_assert_compatibility(&e->super_exception);
  __return_storage_ptr__ =
       (clone_impl<boost::exception_detail::error_info_injector<boost::bad_get>_> *)
       __cxa_allocate_exception(0x38);
  enable_error_info<boost::bad_get>(&local_40,local_10);
  enable_current_exception<boost::exception_detail::error_info_injector<boost::bad_get>>
            (__return_storage_ptr__,(boost *)&local_40,x);
  __cxa_throw(__return_storage_ptr__,
              &exception_detail::
               clone_impl<boost::exception_detail::error_info_injector<boost::bad_get>>::typeinfo,
              exception_detail::
              clone_impl<boost::exception_detail::error_info_injector<boost::bad_get>_>::~clone_impl
             );
}

Assistant:

BOOST_NORETURN inline void throw_exception( E const & e )
{
    //All boost exceptions are required to derive from std::exception,
    //to ensure compatibility with BOOST_NO_EXCEPTIONS.
    throw_exception_assert_compatibility(e);

#ifndef BOOST_EXCEPTION_DISABLE
    throw enable_current_exception(enable_error_info(e));
#else
    throw e;
#endif
}